

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.hpp
# Opt level: O1

String * __thiscall stick::String::operator=(String *this,String *_other)

{
  ulong uVar1;
  char *__src;
  int iVar2;
  undefined4 extraout_var;
  
  if (this->m_cStr != (char *)0x0) {
    (*this->m_allocator->_vptr_Allocator[3])();
    this->m_cStr = (char *)0x0;
    this->m_length = 0;
    this->m_capacity = 0;
  }
  this->m_allocator = _other->m_allocator;
  if (_other->m_cStr != (char *)0x0) {
    uVar1 = _other->m_length;
    if (uVar1 < this->m_length) {
      this->m_cStr[uVar1] = '\0';
    }
    if (this->m_capacity < uVar1) {
      __src = this->m_cStr;
      iVar2 = (*this->m_allocator->_vptr_Allocator[2])(this->m_allocator,uVar1 + 1,1);
      this->m_cStr = (char *)CONCAT44(extraout_var,iVar2);
      memset((char *)CONCAT44(extraout_var,iVar2),0,uVar1 + 1);
      if (this->m_cStr == (char *)0x0) {
        __assert_fail("m_cStr != nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/mokafolio[P]Stick/Stick/String.hpp"
                      ,0x1a0,"void stick::String::reserve(Size)");
      }
      if (__src != (char *)0x0) {
        strcpy(this->m_cStr,__src);
        (*this->m_allocator->_vptr_Allocator[3])();
      }
      this->m_capacity = uVar1;
    }
    this->m_length = uVar1;
    strcpy(this->m_cStr,_other->m_cStr);
  }
  return this;
}

Assistant:

inline String & operator=(const String & _other)
    {
        deallocate();
        //@TODO: By default we should keep the allocator we were using maybe?
        m_allocator = _other.m_allocator;
        if (_other.m_cStr)
        {
            resize(_other.m_length);
            strcpy(m_cStr, _other.m_cStr);
        }

        return *this;
    }